

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

void Ssw_SmlAssignDist1(Ssw_Sml_t *p,uint *pPat)

{
  uint *puVar1;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar2;
  Aig_Man_t *pAVar3;
  int iVar4;
  uint uVar5;
  int iFrame;
  int iVar6;
  int iVar7;
  uint uVar8;
  int i;
  
  iVar4 = p->nFrames;
  if (iVar4 < 1) {
    __assert_fail("p->nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                  ,0x273,"void Ssw_SmlAssignDist1(Ssw_Sml_t *, unsigned int *)");
  }
  if (iVar4 == 1) {
    uVar5 = 0;
    while( true ) {
      p_00 = p->pAig->vCis;
      if (p_00->nSize <= (int)uVar5) break;
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_00,uVar5);
      Ssw_SmlObjAssignConst(p,pAVar2,(uint)((pPat[uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0),0);
      uVar5 = uVar5 + 1;
    }
    uVar5 = p->pAig->nObjs[2];
    uVar8 = p->nWordsTotal * 0x20 - 1;
    if ((int)uVar5 < (int)uVar8) {
      uVar8 = uVar5;
    }
    uVar5 = 0;
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    while (uVar8 != uVar5) {
      pAVar2 = Aig_ManCi(p->pAig,uVar5);
      uVar5 = uVar5 + 1;
      puVar1 = (uint *)((long)&p[1].pAig +
                       (ulong)(uVar5 >> 5) * 4 + (long)p->nWordsTotal * (long)pAVar2->Id * 4);
      *puVar1 = *puVar1 ^ 1 << ((byte)uVar5 & 0x1f);
    }
  }
  else {
    pAVar3 = p->pAig;
    iVar6 = pAVar3->nObjs[2] - pAVar3->nRegs;
    iVar7 = 0;
    for (iFrame = 0; i = 0, iFrame < iVar4; iFrame = iFrame + 1) {
      for (; i < pAVar3->nTruePis; i = i + 1) {
        pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAVar3->vCis,i);
        Ssw_SmlObjAssignConst
                  (p,pAVar2,(uint)((pPat[i + iVar7 >> 5] >> (i + iVar7 & 0x1fU) & 1) != 0),iFrame);
        pAVar3 = p->pAig;
      }
      iVar4 = p->nFrames;
      iVar7 = iVar7 + iVar6;
    }
    for (; i < pAVar3->nRegs; i = i + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAVar3->vCis,pAVar3->nTruePis + i);
      uVar5 = p->nFrames * iVar6 + i;
      Ssw_SmlObjAssignConst(p,pAVar2,(uint)((pPat[(int)uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0),0);
      pAVar3 = p->pAig;
    }
  }
  return;
}

Assistant:

void Ssw_SmlAssignDist1( Ssw_Sml_t * p, unsigned * pPat )
{
    Aig_Obj_t * pObj;
    int f, i, k, Limit, nTruePis;
    assert( p->nFrames > 0 );
    if ( p->nFrames == 1 )
    {
        // copy the PI info
        Aig_ManForEachCi( p->pAig, pObj, i )
            Ssw_SmlObjAssignConst( p, pObj, Abc_InfoHasBit(pPat, i), 0 );
        // flip one bit
        Limit = Abc_MinInt( Aig_ManCiNum(p->pAig), p->nWordsTotal * 32 - 1 );
        for ( i = 0; i < Limit; i++ )
            Abc_InfoXorBit( Ssw_ObjSim( p, Aig_ManCi(p->pAig,i)->Id ), i+1 );
    }
    else
    {
        int fUseDist1 = 0;

        // copy the PI info for each frame
        nTruePis = Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig);
        for ( f = 0; f < p->nFrames; f++ )
            Saig_ManForEachPi( p->pAig, pObj, i )
                Ssw_SmlObjAssignConst( p, pObj, Abc_InfoHasBit(pPat, nTruePis * f + i), f );
        // copy the latch info
        k = 0;
        Saig_ManForEachLo( p->pAig, pObj, i )
            Ssw_SmlObjAssignConst( p, pObj, Abc_InfoHasBit(pPat, nTruePis * p->nFrames + k++), 0 );
//        assert( p->pFrames == NULL || nTruePis * p->nFrames + k == Aig_ManCiNum(p->pFrames) );

        // flip one bit of the last frame
        if ( fUseDist1 ) //&& p->nFrames == 2 )
        {
            Limit = Abc_MinInt( nTruePis, p->nWordsFrame * 32 - 1 );
            for ( i = 0; i < Limit; i++ )
                Abc_InfoXorBit( Ssw_ObjSim( p, Aig_ManCi(p->pAig, i)->Id ) + p->nWordsFrame*(p->nFrames-1), i+1 );
        }
    }
}